

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name.c
# Opt level: O1

int ndn_name_tlv_decode(ndn_decoder_t *decoder,ndn_name_t *name)

{
  byte bVar1;
  uint uVar2;
  uint32_t uVar3;
  uint8_t *puVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  ndn_name_t *component;
  uint uVar9;
  bool bVar10;
  
  puVar4 = decoder->input_value;
  uVar2 = decoder->offset;
  bVar1 = puVar4[uVar2];
  uVar9 = (uint)bVar1;
  if (bVar1 < 0xfd) {
    iVar6 = 1;
LAB_0010cc83:
    decoder->offset = iVar6 + uVar2;
    bVar10 = uVar9 == 7;
    iVar6 = 0;
    bVar5 = true;
  }
  else {
    uVar7 = decoder->input_size - uVar2;
    if (2 < uVar7 && bVar1 == 0xfd) {
      uVar9 = (uint)CONCAT11(puVar4[uVar2 + 1],puVar4[uVar2 + 2]);
      iVar6 = 3;
      goto LAB_0010cc83;
    }
    if (4 < uVar7 && uVar9 == 0xfe) {
      uVar9 = (uint)puVar4[uVar2 + 4] |
              (uint)puVar4[uVar2 + 3] << 8 |
              (uint)puVar4[uVar2 + 2] << 0x10 | (uint)puVar4[uVar2 + 1] << 0x18;
      iVar6 = 5;
      goto LAB_0010cc83;
    }
    iVar6 = -0xe;
    bVar10 = false;
    bVar5 = false;
  }
  if (!bVar5) {
    return iVar6;
  }
  if (!bVar10) {
    return -0xc;
  }
  uVar2 = decoder->offset;
  bVar1 = puVar4[uVar2];
  uVar9 = (uint)bVar1;
  if (bVar1 < 0xfd) {
    iVar6 = 1;
  }
  else {
    uVar7 = decoder->input_size - uVar2;
    if (uVar7 < 3 || bVar1 != 0xfd) {
      if (uVar7 < 5 || uVar9 != 0xfe) {
        iVar6 = -0xe;
        uVar9 = 0;
        bVar5 = false;
        goto LAB_0010cd70;
      }
      uVar9 = (uint)puVar4[uVar2 + 4] |
              (uint)puVar4[uVar2 + 3] << 8 |
              (uint)puVar4[uVar2 + 2] << 0x10 | (uint)puVar4[uVar2 + 1] << 0x18;
      iVar6 = 5;
    }
    else {
      uVar9 = (uint)CONCAT11(puVar4[uVar2 + 1],puVar4[uVar2 + 2]);
      iVar6 = 3;
    }
  }
  decoder->offset = iVar6 + uVar2;
  iVar6 = 0;
  bVar5 = true;
LAB_0010cd70:
  if (bVar5) {
    uVar3 = decoder->offset;
    lVar8 = 0;
    component = name;
    do {
      if (uVar9 + uVar3 <= decoder->offset) {
        name->components_size = (uint8_t)lVar8;
        return 0;
      }
      if (lVar8 == 10) {
        return -10;
      }
      iVar6 = name_component_tlv_decode(decoder,component->components);
      lVar8 = lVar8 + 1;
      component = (ndn_name_t *)(component->components + 1);
    } while (-1 < iVar6);
  }
  return iVar6;
}

Assistant:

int
ndn_name_tlv_decode(ndn_decoder_t* decoder, ndn_name_t* name)
{
  int ret_val = -1;
  uint32_t type = 0;
  ret_val = decoder_get_type(decoder, &type);
  if (ret_val != NDN_SUCCESS) return ret_val;
  if (type != TLV_Name) {
    return NDN_WRONG_TLV_TYPE;
  }
  uint32_t length = 0;
  ret_val = decoder_get_length(decoder, &length);
  if (ret_val != NDN_SUCCESS) return ret_val;
  uint32_t start_offset = decoder->offset;
  int counter = 0;
  while (decoder->offset < start_offset + length) {
    if (counter >= NDN_NAME_COMPONENTS_SIZE)
      return NDN_OVERSIZE;
    int result = name_component_tlv_decode(decoder, &name->components[counter]);
    if (result < 0)
      return result;
    ++counter;
  }
  name->components_size = counter;
  return 0;
}